

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

void abort_save_pos_for_undo_proc(Am_Object *command_obj)

{
  Am_Value *in_value;
  undefined1 local_50 [8];
  Am_Value old_value;
  Am_Object scroll_command;
  Am_Object local_30;
  Am_Object scrollbar;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *command_obj_local;
  
  local_10 = command_obj;
  Am_Object::Am_Object(&local_18,command_obj);
  clear_save_pos_for_undo_proc(&local_18);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Get_Owner(&scroll_command,(Am_Slot_Flags)command_obj);
  Am_Object::Get_Owner(&local_30,(Am_Slot_Flags)&scroll_command);
  Am_Object::~Am_Object(&scroll_command);
  Am_Object::Get_Object((Am_Object *)&old_value.value,(Am_Slot_Key)&local_30,0xc5);
  Am_Value::Am_Value((Am_Value *)local_50);
  in_value = Am_Object::Peek((Am_Object *)&old_value.value,0x16c,0);
  Am_Value::operator=((Am_Value *)local_50,in_value);
  Am_Object::Set(&local_30,0x169,(Am_Value *)local_50,0);
  Am_Value::~Am_Value((Am_Value *)local_50);
  Am_Object::~Am_Object((Am_Object *)&old_value.value);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, abort_save_pos_for_undo,
                 (Am_Object command_obj))
{
  clear_save_pos_for_undo_proc(command_obj);
  //first owner is the interactor
  Am_Object scrollbar = command_obj.Get_Owner().Get_Owner();
  Am_Object scroll_command = scrollbar.Get_Object(Am_COMMAND);
  Am_Value old_value;
  old_value = scroll_command.Peek(Am_OLD_VALUE);
  scrollbar.Set(Am_VALUE, old_value);
  // std::cout << "...Aborting, setting " << scrollbar << " value with " <<
  //   old_value  << " from " << scroll_command <<std::endl <<std::flush;
}